

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VScaleVectorArray_Serial(int nvec,realtype *c,N_Vector *X,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (0 < nvec) {
    if (nvec == 1) {
      N_VScale_Serial(*c,*X,*Z);
    }
    else {
      uVar4 = 0;
      if (0 < (int)*(*Z)->content) {
        uVar4 = (ulong)*(*Z)->content;
      }
      if (X == Z) {
        for (uVar5 = 0; uVar5 != (uint)nvec; uVar5 = uVar5 + 1) {
          lVar1 = *(long *)((long)X[uVar5]->content + 8);
          for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
            *(double *)(lVar1 + uVar3 * 8) = c[uVar5] * *(double *)(lVar1 + uVar3 * 8);
          }
        }
      }
      else {
        for (uVar5 = 0; uVar5 != (uint)nvec; uVar5 = uVar5 + 1) {
          lVar1 = *(long *)((long)X[uVar5]->content + 8);
          lVar2 = *(long *)((long)Z[uVar5]->content + 8);
          for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
            *(double *)(lVar2 + uVar3 * 8) = c[uVar5] * *(double *)(lVar1 + uVar3 * 8);
          }
        }
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VScaleVectorArray_Serial(int nvec, realtype* c, N_Vector* X, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[i] *= c[i]
   */
  if (X == Z) {
    for (i=0; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        xd[j] *= c[i];
      }
    }
    return(0);
  }

  /*
   * Z[i] = c[i] * X[i]
   */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c[i] * xd[j];
    }
  }
  return(0);
}